

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::setCapacity
          (Vector<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *this,
          size_t newSize)

{
  __off_t in_RDX;
  ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> newBuilder;
  ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> local_30;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 5)) {
    ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_30.ptr = kj::_::HeapArrayDisposer::
                 allocateUninitialized<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry>
                           (newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry>::
  addAll<kj::ArrayBuilder<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry>>
            ((ArrayBuilder<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry> *)&local_30,
             &this->builder);
  ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::operator=
            (&this->builder,&local_30);
  ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }